

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_distinct_from.cpp
# Opt level: O0

idx_t duckdb::
      DistinctSelectFlat<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::DistinctFrom,false,false>
                (Vector *left,Vector *right,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  uhugeint_t *rmask;
  uhugeint_t *lmask;
  uhugeint_t *rdata_00;
  idx_t iVar1;
  SelectionVector *in_RCX;
  idx_t in_RDX;
  SelectionVector *in_R8;
  SelectionVector *in_R9;
  uhugeint_t *rdata;
  uhugeint_t *ldata;
  uhugeint_t *ldata_00;
  
  rmask = FlatVector::GetData<duckdb::uhugeint_t>((Vector *)0x16b92ac);
  lmask = FlatVector::GetData<duckdb::uhugeint_t>((Vector *)0x16b92bb);
  ldata_00 = lmask;
  rdata_00 = (uhugeint_t *)FlatVector::Validity((Vector *)0x16b92f2);
  FlatVector::Validity((Vector *)0x16b9301);
  iVar1 = DistinctSelectFlatLoopSwitch<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::DistinctFrom,false,false>
                    (ldata_00,rdata_00,in_RCX,in_RDX,(ValidityMask *)lmask,(ValidityMask *)rmask,
                     in_R9,in_R8);
  return iVar1;
}

Assistant:

static idx_t DistinctSelectFlat(Vector &left, Vector &right, const SelectionVector *sel, idx_t count,
                                SelectionVector *true_sel, SelectionVector *false_sel) {
	auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
	auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);
	if (LEFT_CONSTANT) {
		ValidityMask validity;
		if (ConstantVector::IsNull(left)) {
			validity.SetAllInvalid(1);
		}
		return DistinctSelectFlatLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, sel, count, validity, FlatVector::Validity(right), true_sel, false_sel);
	} else if (RIGHT_CONSTANT) {
		ValidityMask validity;
		if (ConstantVector::IsNull(right)) {
			validity.SetAllInvalid(1);
		}
		return DistinctSelectFlatLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, sel, count, FlatVector::Validity(left), validity, true_sel, false_sel);
	} else {
		return DistinctSelectFlatLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, sel, count, FlatVector::Validity(left), FlatVector::Validity(right), true_sel, false_sel);
	}
}